

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::BuildFieldOrExtension
          (DescriptorBuilder *this,FieldDescriptorProto *proto,Descriptor *parent,
          FieldDescriptor *result,bool is_extension)

{
  Tables *pTVar1;
  Symbol symbol;
  undefined8 uVar2;
  __type _Var3;
  bool bVar4;
  FieldDescriptor FVar5;
  int32 iVar6;
  int iVar7;
  Type TVar8;
  CppType CVar9;
  ulong uVar10;
  string *psVar11;
  long lVar12;
  int64 iVar13;
  uint64 uVar14;
  char *pcVar15;
  OneofDescriptor *pOVar16;
  FieldOptions *orig_options;
  string *psVar17;
  float fVar18;
  double dVar19;
  SubstituteArg *in_stack_fffffffffffff5c8;
  string *local_740;
  Symbol local_730;
  SubstituteArg local_720;
  SubstituteArg local_6f0;
  SubstituteArg local_6c0;
  SubstituteArg local_690;
  SubstituteArg local_660;
  SubstituteArg local_630;
  SubstituteArg local_600;
  SubstituteArg local_5d0;
  SubstituteArg local_5a0;
  SubstituteArg local_570;
  string local_540;
  SubstituteArg local_520;
  SubstituteArg local_4f0;
  SubstituteArg local_4c0;
  SubstituteArg local_490;
  SubstituteArg local_460;
  SubstituteArg local_430;
  SubstituteArg local_400;
  SubstituteArg local_3d0;
  SubstituteArg local_3a0;
  SubstituteArg local_370;
  string local_340;
  SubstituteArg local_320;
  SubstituteArg local_2f0;
  SubstituteArg local_2c0;
  SubstituteArg local_290;
  SubstituteArg local_260;
  SubstituteArg local_230;
  SubstituteArg local_200;
  SubstituteArg local_1d0;
  SubstituteArg local_1a0;
  SubstituteArg local_170;
  string local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string local_e0;
  char *local_c0;
  char *end_pos;
  string local_b0;
  string local_90;
  undefined1 local_60 [8];
  string lowercase_name;
  string *full_name;
  string *scope;
  bool is_extension_local;
  FieldDescriptor *result_local;
  Descriptor *parent_local;
  FieldDescriptorProto *proto_local;
  DescriptorBuilder *this_local;
  
  if (parent == (Descriptor *)0x0) {
    local_740 = FileDescriptor::package_abi_cxx11_(this->file_);
  }
  else {
    local_740 = Descriptor::full_name_abi_cxx11_(parent);
  }
  lowercase_name.field_2._8_8_ = DescriptorPool::Tables::AllocateString(this->tables_,local_740);
  uVar10 = std::__cxx11::string::empty();
  if ((uVar10 & 1) == 0) {
    std::__cxx11::string::append(lowercase_name.field_2._8_8_,'\x01');
  }
  uVar2 = lowercase_name.field_2._8_8_;
  FieldDescriptorProto::name_abi_cxx11_(proto);
  std::__cxx11::string::append((string *)uVar2);
  psVar11 = FieldDescriptorProto::name_abi_cxx11_(proto);
  ValidateSymbolName(this,psVar11,(string *)lowercase_name.field_2._8_8_,&proto->super_Message);
  pTVar1 = this->tables_;
  psVar11 = FieldDescriptorProto::name_abi_cxx11_(proto);
  psVar11 = DescriptorPool::Tables::AllocateString(pTVar1,psVar11);
  *(string **)result = psVar11;
  *(undefined8 *)(result + 8) = lowercase_name.field_2._8_8_;
  *(FileDescriptor **)(result + 0x30) = this->file_;
  iVar6 = FieldDescriptorProto::number(proto);
  *(int32 *)(result + 0x38) = iVar6;
  result[0x50] = (FieldDescriptor)is_extension;
  psVar11 = FieldDescriptorProto::name_abi_cxx11_(proto);
  std::__cxx11::string::string((string *)local_60,(string *)psVar11);
  LowerString((string *)local_60);
  psVar11 = FieldDescriptorProto::name_abi_cxx11_(proto);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_60,psVar11);
  if (_Var3) {
    *(undefined8 *)(result + 0x10) = *(undefined8 *)result;
  }
  else {
    psVar11 = DescriptorPool::Tables::AllocateString(this->tables_,(string *)local_60);
    *(string **)(result + 0x10) = psVar11;
  }
  pTVar1 = this->tables_;
  psVar11 = FieldDescriptorProto::name_abi_cxx11_(proto);
  anon_unknown_1::ToCamelCase(&local_90,psVar11,true);
  psVar11 = DescriptorPool::Tables::AllocateString(pTVar1,&local_90);
  *(string **)(result + 0x18) = psVar11;
  std::__cxx11::string::~string((string *)&local_90);
  bVar4 = FieldDescriptorProto::has_json_name(proto);
  if (bVar4) {
    result[0x20] = (FieldDescriptor)0x1;
    pTVar1 = this->tables_;
    psVar11 = FieldDescriptorProto::json_name_abi_cxx11_(proto);
    psVar11 = DescriptorPool::Tables::AllocateString(pTVar1,psVar11);
    *(string **)(result + 0x28) = psVar11;
  }
  else {
    result[0x20] = (FieldDescriptor)0x0;
    pTVar1 = this->tables_;
    psVar11 = FieldDescriptorProto::name_abi_cxx11_(proto);
    anon_unknown_1::ToJsonName(&local_b0,psVar11);
    psVar11 = DescriptorPool::Tables::AllocateString(pTVar1,&local_b0);
    *(string **)(result + 0x28) = psVar11;
    std::__cxx11::string::~string((string *)&local_b0);
  }
  end_pos._4_4_ = FieldDescriptorProto::type(proto);
  iVar7 = internal::implicit_cast<int,google::protobuf::FieldDescriptorProto_Type>
                    ((FieldDescriptorProto_Type *)((long)&end_pos + 4));
  *(int *)(result + 0x48) = iVar7;
  end_pos._0_4_ = FieldDescriptorProto::label(proto);
  iVar7 = internal::implicit_cast<int,google::protobuf::FieldDescriptorProto_Label>
                    ((FieldDescriptorProto_Label *)&end_pos);
  *(int *)(result + 0x4c) = iVar7;
  if ((((byte)result[0x50] & 1) != 0) && (*(int *)(result + 0x4c) == 2)) {
    psVar11 = FieldDescriptor::full_name_abi_cxx11_(result);
    AddError(this,psVar11,&proto->super_Message,TYPE,
             "Message extensions cannot have required fields.");
  }
  *(undefined8 *)(result + 0x58) = 0;
  *(undefined8 *)(result + 0x68) = 0;
  *(undefined8 *)(result + 0x70) = 0;
  *(undefined8 *)(result + 0x78) = 0;
  *(undefined8 *)(result + 0x88) = 0;
  *(undefined8 *)(result + 0x40) = 0;
  *(undefined8 *)(result + 0xa0) = 0;
  *(undefined8 *)(result + 0x90) = 0;
  FVar5 = (FieldDescriptor)FieldDescriptorProto::has_default_value(proto);
  result[0x98] = FVar5;
  bVar4 = FieldDescriptorProto::has_default_value(proto);
  if ((bVar4) && (bVar4 = FieldDescriptor::is_repeated(result), bVar4)) {
    psVar11 = FieldDescriptor::full_name_abi_cxx11_(result);
    AddError(this,psVar11,&proto->super_Message,DEFAULT_VALUE,
             "Repeated fields can\'t have default values.");
  }
  bVar4 = FieldDescriptorProto::has_type(proto);
  if (bVar4) {
    bVar4 = FieldDescriptorProto::has_default_value(proto);
    if (bVar4) {
      local_c0 = (char *)0x0;
      CVar9 = FieldDescriptor::cpp_type(result);
      switch(CVar9) {
      case CPPTYPE_INT32:
        FieldDescriptorProto::default_value_abi_cxx11_(proto);
        pcVar15 = (char *)std::__cxx11::string::c_str();
        lVar12 = strtol(pcVar15,&local_c0,0);
        *(int *)(result + 0xa0) = (int)lVar12;
        break;
      case CPPTYPE_INT64:
        FieldDescriptorProto::default_value_abi_cxx11_(proto);
        pcVar15 = (char *)std::__cxx11::string::c_str();
        iVar13 = strto64(pcVar15,&local_c0,0);
        *(int64 *)(result + 0xa0) = iVar13;
        break;
      case CPPTYPE_UINT32:
        FieldDescriptorProto::default_value_abi_cxx11_(proto);
        pcVar15 = (char *)std::__cxx11::string::c_str();
        uVar10 = strtoul(pcVar15,&local_c0,0);
        *(int *)(result + 0xa0) = (int)uVar10;
        break;
      case CPPTYPE_UINT64:
        FieldDescriptorProto::default_value_abi_cxx11_(proto);
        pcVar15 = (char *)std::__cxx11::string::c_str();
        uVar14 = strtou64(pcVar15,&local_c0,0);
        *(uint64 *)(result + 0xa0) = uVar14;
        break;
      case CPPTYPE_DOUBLE:
        psVar11 = FieldDescriptorProto::default_value_abi_cxx11_(proto);
        bVar4 = std::operator==(psVar11,"inf");
        if (bVar4) {
          dVar19 = std::numeric_limits<double>::infinity();
          *(double *)(result + 0xa0) = dVar19;
        }
        else {
          psVar11 = FieldDescriptorProto::default_value_abi_cxx11_(proto);
          bVar4 = std::operator==(psVar11,"-inf");
          if (bVar4) {
            dVar19 = std::numeric_limits<double>::infinity();
            *(double *)(result + 0xa0) = -dVar19;
          }
          else {
            psVar11 = FieldDescriptorProto::default_value_abi_cxx11_(proto);
            bVar4 = std::operator==(psVar11,"nan");
            if (bVar4) {
              dVar19 = std::numeric_limits<double>::quiet_NaN();
              *(double *)(result + 0xa0) = dVar19;
            }
            else {
              FieldDescriptorProto::default_value_abi_cxx11_(proto);
              pcVar15 = (char *)std::__cxx11::string::c_str();
              dVar19 = io::NoLocaleStrtod(pcVar15,&local_c0);
              *(double *)(result + 0xa0) = dVar19;
            }
          }
        }
        break;
      case CPPTYPE_FLOAT:
        psVar11 = FieldDescriptorProto::default_value_abi_cxx11_(proto);
        bVar4 = std::operator==(psVar11,"inf");
        if (bVar4) {
          fVar18 = std::numeric_limits<float>::infinity();
          *(float *)(result + 0xa0) = fVar18;
        }
        else {
          psVar11 = FieldDescriptorProto::default_value_abi_cxx11_(proto);
          bVar4 = std::operator==(psVar11,"-inf");
          if (bVar4) {
            fVar18 = std::numeric_limits<float>::infinity();
            *(float *)(result + 0xa0) = -fVar18;
          }
          else {
            psVar11 = FieldDescriptorProto::default_value_abi_cxx11_(proto);
            bVar4 = std::operator==(psVar11,"nan");
            if (bVar4) {
              fVar18 = std::numeric_limits<float>::quiet_NaN();
              *(float *)(result + 0xa0) = fVar18;
            }
            else {
              FieldDescriptorProto::default_value_abi_cxx11_(proto);
              pcVar15 = (char *)std::__cxx11::string::c_str();
              dVar19 = io::NoLocaleStrtod(pcVar15,&local_c0);
              fVar18 = io::SafeDoubleToFloat(dVar19);
              *(float *)(result + 0xa0) = fVar18;
            }
          }
        }
        break;
      case CPPTYPE_BOOL:
        psVar11 = FieldDescriptorProto::default_value_abi_cxx11_(proto);
        bVar4 = std::operator==(psVar11,"true");
        if (bVar4) {
          result[0xa0] = (FieldDescriptor)0x1;
        }
        else {
          psVar11 = FieldDescriptorProto::default_value_abi_cxx11_(proto);
          bVar4 = std::operator==(psVar11,"false");
          if (bVar4) {
            result[0xa0] = (FieldDescriptor)0x0;
          }
          else {
            psVar11 = FieldDescriptor::full_name_abi_cxx11_(result);
            AddError(this,psVar11,&proto->super_Message,DEFAULT_VALUE,
                     "Boolean default must be true or false.");
          }
        }
        break;
      case CPPTYPE_ENUM:
        *(undefined8 *)(result + 0xa0) = 0;
        break;
      case CPPTYPE_STRING:
        TVar8 = FieldDescriptor::type(result);
        if (TVar8 == TYPE_BYTES) {
          pTVar1 = this->tables_;
          psVar11 = FieldDescriptorProto::default_value_abi_cxx11_(proto);
          UnescapeCEscapeString(&local_e0,psVar11);
          psVar11 = DescriptorPool::Tables::AllocateString(pTVar1,&local_e0);
          *(string **)(result + 0xa0) = psVar11;
          std::__cxx11::string::~string((string *)&local_e0);
        }
        else {
          pTVar1 = this->tables_;
          psVar11 = FieldDescriptorProto::default_value_abi_cxx11_(proto);
          psVar11 = DescriptorPool::Tables::AllocateString(pTVar1,psVar11);
          *(string **)(result + 0xa0) = psVar11;
        }
        break;
      case CPPTYPE_MESSAGE:
        psVar11 = FieldDescriptor::full_name_abi_cxx11_(result);
        AddError(this,psVar11,&proto->super_Message,DEFAULT_VALUE,
                 "Messages can\'t have default values.");
        result[0x98] = (FieldDescriptor)0x0;
      }
      if (local_c0 != (char *)0x0) {
        FieldDescriptorProto::default_value_abi_cxx11_(proto);
        uVar10 = std::__cxx11::string::empty();
        if (((uVar10 & 1) != 0) || (*local_c0 != '\0')) {
          psVar11 = FieldDescriptor::full_name_abi_cxx11_(result);
          psVar17 = FieldDescriptorProto::default_value_abi_cxx11_(proto);
          std::operator+(&local_120,"Couldn\'t parse default value \"",psVar17);
          std::operator+(&local_100,&local_120,"\".");
          AddError(this,psVar11,&proto->super_Message,DEFAULT_VALUE,&local_100);
          std::__cxx11::string::~string((string *)&local_100);
          std::__cxx11::string::~string((string *)&local_120);
        }
      }
    }
    else {
      CVar9 = FieldDescriptor::cpp_type(result);
      switch(CVar9) {
      case CPPTYPE_INT32:
        *(undefined4 *)(result + 0xa0) = 0;
        break;
      case CPPTYPE_INT64:
        *(undefined8 *)(result + 0xa0) = 0;
        break;
      case CPPTYPE_UINT32:
        *(undefined4 *)(result + 0xa0) = 0;
        break;
      case CPPTYPE_UINT64:
        *(undefined8 *)(result + 0xa0) = 0;
        break;
      case CPPTYPE_DOUBLE:
        *(undefined8 *)(result + 0xa0) = 0;
        break;
      case CPPTYPE_FLOAT:
        *(undefined4 *)(result + 0xa0) = 0;
        break;
      case CPPTYPE_BOOL:
        result[0xa0] = (FieldDescriptor)0x0;
        break;
      case CPPTYPE_ENUM:
        *(undefined8 *)(result + 0xa0) = 0;
        break;
      case CPPTYPE_STRING:
        psVar11 = internal::GetEmptyString_abi_cxx11_();
        *(string **)(result + 0xa0) = psVar11;
        break;
      case CPPTYPE_MESSAGE:
      }
    }
  }
  iVar7 = FieldDescriptor::number(result);
  if (iVar7 < 1) {
    psVar11 = FieldDescriptor::full_name_abi_cxx11_(result);
    AddError(this,psVar11,&proto->super_Message,NUMBER,"Field numbers must be positive integers.");
  }
  else if ((is_extension) || (iVar7 = FieldDescriptor::number(result), iVar7 < 0x20000000)) {
    iVar7 = FieldDescriptor::number(result);
    if ((18999 < iVar7) && (iVar7 = FieldDescriptor::number(result), iVar7 < 20000)) {
      psVar11 = FieldDescriptor::full_name_abi_cxx11_(result);
      strings::internal::SubstituteArg::SubstituteArg(&local_370,19000);
      strings::internal::SubstituteArg::SubstituteArg(&local_3a0,19999);
      strings::internal::SubstituteArg::SubstituteArg(&local_3d0);
      strings::internal::SubstituteArg::SubstituteArg(&local_400);
      strings::internal::SubstituteArg::SubstituteArg(&local_430);
      strings::internal::SubstituteArg::SubstituteArg(&local_460);
      strings::internal::SubstituteArg::SubstituteArg(&local_490);
      strings::internal::SubstituteArg::SubstituteArg(&local_4c0);
      strings::internal::SubstituteArg::SubstituteArg(&local_4f0);
      strings::internal::SubstituteArg::SubstituteArg(&local_520);
      strings::Substitute_abi_cxx11_
                (&local_340,
                 (strings *)
                 "Field numbers $0 through $1 are reserved for the protocol buffer library implementation."
                 ,(char *)&local_370,&local_3a0,&local_3d0,&local_400,&local_430,&local_460,
                 &local_490,&local_4c0,&local_4f0,&local_520,in_stack_fffffffffffff5c8);
      AddError(this,psVar11,&proto->super_Message,NUMBER,&local_340);
      std::__cxx11::string::~string((string *)&local_340);
    }
  }
  else {
    psVar11 = FieldDescriptor::full_name_abi_cxx11_(result);
    strings::internal::SubstituteArg::SubstituteArg(&local_170,0x1fffffff);
    strings::internal::SubstituteArg::SubstituteArg(&local_1a0);
    strings::internal::SubstituteArg::SubstituteArg(&local_1d0);
    strings::internal::SubstituteArg::SubstituteArg(&local_200);
    strings::internal::SubstituteArg::SubstituteArg(&local_230);
    strings::internal::SubstituteArg::SubstituteArg(&local_260);
    strings::internal::SubstituteArg::SubstituteArg(&local_290);
    strings::internal::SubstituteArg::SubstituteArg(&local_2c0);
    strings::internal::SubstituteArg::SubstituteArg(&local_2f0);
    strings::internal::SubstituteArg::SubstituteArg(&local_320);
    strings::Substitute_abi_cxx11_
              (&local_140,(strings *)"Field numbers cannot be greater than $0.",(char *)&local_170,
               &local_1a0,&local_1d0,&local_200,&local_230,&local_260,&local_290,&local_2c0,
               &local_2f0,&local_320,in_stack_fffffffffffff5c8);
    AddError(this,psVar11,&proto->super_Message,NUMBER,&local_140);
    std::__cxx11::string::~string((string *)&local_140);
  }
  if (is_extension) {
    bVar4 = FieldDescriptorProto::has_extendee(proto);
    if (!bVar4) {
      psVar11 = FieldDescriptor::full_name_abi_cxx11_(result);
      AddError(this,psVar11,&proto->super_Message,EXTENDEE,
               "FieldDescriptorProto.extendee not set for extension field.");
    }
    *(Descriptor **)(result + 0x68) = parent;
    bVar4 = FieldDescriptorProto::has_oneof_index(proto);
    if (bVar4) {
      psVar11 = FieldDescriptor::full_name_abi_cxx11_(result);
      AddError(this,psVar11,&proto->super_Message,OTHER,
               "FieldDescriptorProto.oneof_index should not be set for extensions.");
    }
    *(undefined8 *)(result + 0x60) = 0;
  }
  else {
    bVar4 = FieldDescriptorProto::has_extendee(proto);
    if (bVar4) {
      psVar11 = FieldDescriptor::full_name_abi_cxx11_(result);
      AddError(this,psVar11,&proto->super_Message,EXTENDEE,
               "FieldDescriptorProto.extendee set for non-extension field.");
    }
    *(Descriptor **)(result + 0x58) = parent;
    bVar4 = FieldDescriptorProto::has_oneof_index(proto);
    if (bVar4) {
      iVar6 = FieldDescriptorProto::oneof_index(proto);
      if (-1 < iVar6) {
        iVar6 = FieldDescriptorProto::oneof_index(proto);
        iVar7 = Descriptor::oneof_decl_count(parent);
        if (iVar6 < iVar7) {
          iVar6 = FieldDescriptorProto::oneof_index(proto);
          pOVar16 = Descriptor::oneof_decl(parent,iVar6);
          *(OneofDescriptor **)(result + 0x60) = pOVar16;
          goto LAB_00a86b1c;
        }
      }
      psVar11 = FieldDescriptor::full_name_abi_cxx11_(result);
      iVar6 = FieldDescriptorProto::oneof_index(proto);
      strings::internal::SubstituteArg::SubstituteArg(&local_570,iVar6);
      psVar17 = Descriptor::name_abi_cxx11_(parent);
      strings::internal::SubstituteArg::SubstituteArg(&local_5a0,psVar17);
      strings::internal::SubstituteArg::SubstituteArg(&local_5d0);
      strings::internal::SubstituteArg::SubstituteArg(&local_600);
      strings::internal::SubstituteArg::SubstituteArg(&local_630);
      strings::internal::SubstituteArg::SubstituteArg(&local_660);
      strings::internal::SubstituteArg::SubstituteArg(&local_690);
      strings::internal::SubstituteArg::SubstituteArg(&local_6c0);
      strings::internal::SubstituteArg::SubstituteArg(&local_6f0);
      strings::internal::SubstituteArg::SubstituteArg(&local_720);
      strings::Substitute_abi_cxx11_
                (&local_540,
                 (strings *)"FieldDescriptorProto.oneof_index $0 is out of range for type \"$1\".",
                 (char *)&local_570,&local_5a0,&local_5d0,&local_600,&local_630,&local_660,
                 &local_690,&local_6c0,&local_6f0,&local_720,in_stack_fffffffffffff5c8);
      AddError(this,psVar11,&proto->super_Message,OTHER,&local_540);
      std::__cxx11::string::~string((string *)&local_540);
      *(undefined8 *)(result + 0x60) = 0;
    }
    else {
      *(undefined8 *)(result + 0x60) = 0;
    }
  }
LAB_00a86b1c:
  bVar4 = FieldDescriptorProto::has_options(proto);
  if (bVar4) {
    orig_options = FieldDescriptorProto::options(proto);
    AllocateOptions<google::protobuf::FieldDescriptor>(this,orig_options,result);
  }
  else {
    *(undefined8 *)(result + 0x80) = 0;
  }
  psVar11 = FieldDescriptor::full_name_abi_cxx11_(result);
  psVar17 = FieldDescriptor::name_abi_cxx11_(result);
  Symbol::Symbol(&local_730,result);
  symbol.field_1.descriptor = local_730.field_1.descriptor;
  symbol.type = local_730.type;
  symbol._4_4_ = local_730._4_4_;
  AddSymbol(this,psVar11,parent,psVar17,&proto->super_Message,symbol);
  std::__cxx11::string::~string((string *)local_60);
  return;
}

Assistant:

void DescriptorBuilder::BuildFieldOrExtension(const FieldDescriptorProto& proto,
                                              const Descriptor* parent,
                                              FieldDescriptor* result,
                                              bool is_extension) {
  const string& scope = (parent == NULL) ?
    file_->package() : parent->full_name();
  string* full_name = tables_->AllocateString(scope);
  if (!full_name->empty()) full_name->append(1, '.');
  full_name->append(proto.name());

  ValidateSymbolName(proto.name(), *full_name, proto);

  result->name_         = tables_->AllocateString(proto.name());
  result->full_name_    = full_name;
  result->file_         = file_;
  result->number_       = proto.number();
  result->is_extension_ = is_extension;

  // If .proto files follow the style guide then the name should already be
  // lower-cased.  If that's the case we can just reuse the string we already
  // allocated rather than allocate a new one.
  string lowercase_name(proto.name());
  LowerString(&lowercase_name);
  if (lowercase_name == proto.name()) {
    result->lowercase_name_ = result->name_;
  } else {
    result->lowercase_name_ = tables_->AllocateString(lowercase_name);
  }

  // Don't bother with the above optimization for camel-case names since
  // .proto files that follow the guide shouldn't be using names in this
  // format, so the optimization wouldn't help much.
  result->camelcase_name_ =
      tables_->AllocateString(ToCamelCase(proto.name(),
                                          /* lower_first = */ true));

  if (proto.has_json_name()) {
    result->has_json_name_ = true;
    result->json_name_ = tables_->AllocateString(proto.json_name());
  } else {
    result->has_json_name_ = false;
    result->json_name_ = tables_->AllocateString(ToJsonName(proto.name()));
  }

  // Some compilers do not allow static_cast directly between two enum types,
  // so we must cast to int first.
  result->type_  = static_cast<FieldDescriptor::Type>(
                     implicit_cast<int>(proto.type()));
  result->label_ = static_cast<FieldDescriptor::Label>(
                     implicit_cast<int>(proto.label()));

  // An extension cannot have a required field (b/13365836).
  if (result->is_extension_ &&
      result->label_ == FieldDescriptor::LABEL_REQUIRED) {
    AddError(result->full_name(), proto,
             // Error location `TYPE`: we would really like to indicate
             // `LABEL`, but the `ErrorLocation` enum has no entry for this, and
             // we don't necessarily know about all implementations of the
             // `ErrorCollector` interface to extend them to handle the new
             // error location type properly.
             DescriptorPool::ErrorCollector::TYPE,
             "Message extensions cannot have required fields.");
  }

  // Some of these may be filled in when cross-linking.
  result->containing_type_ = NULL;
  result->extension_scope_ = NULL;
  result->message_type_ = NULL;
  result->enum_type_ = NULL;
  result->type_name_ = NULL;
  result->type_once_ = NULL;
  result->default_value_enum_ = NULL;
  result->default_value_enum_name_ = NULL;

  result->has_default_value_ = proto.has_default_value();
  if (proto.has_default_value() && result->is_repeated()) {
    AddError(result->full_name(), proto,
             DescriptorPool::ErrorCollector::DEFAULT_VALUE,
             "Repeated fields can't have default values.");
  }

  if (proto.has_type()) {
    if (proto.has_default_value()) {
      char* end_pos = NULL;
      switch (result->cpp_type()) {
        case FieldDescriptor::CPPTYPE_INT32:
          result->default_value_int32_ =
            strtol(proto.default_value().c_str(), &end_pos, 0);
          break;
        case FieldDescriptor::CPPTYPE_INT64:
          result->default_value_int64_ =
            strto64(proto.default_value().c_str(), &end_pos, 0);
          break;
        case FieldDescriptor::CPPTYPE_UINT32:
          result->default_value_uint32_ =
            strtoul(proto.default_value().c_str(), &end_pos, 0);
          break;
        case FieldDescriptor::CPPTYPE_UINT64:
          result->default_value_uint64_ =
            strtou64(proto.default_value().c_str(), &end_pos, 0);
          break;
        case FieldDescriptor::CPPTYPE_FLOAT:
          if (proto.default_value() == "inf") {
            result->default_value_float_ =
                std::numeric_limits<float>::infinity();
          } else if (proto.default_value() == "-inf") {
            result->default_value_float_ =
                -std::numeric_limits<float>::infinity();
          } else if (proto.default_value() == "nan") {
            result->default_value_float_ =
                std::numeric_limits<float>::quiet_NaN();
          } else  {
            result->default_value_float_ = io::SafeDoubleToFloat(
                io::NoLocaleStrtod(proto.default_value().c_str(), &end_pos));
          }
          break;
        case FieldDescriptor::CPPTYPE_DOUBLE:
          if (proto.default_value() == "inf") {
            result->default_value_double_ =
                std::numeric_limits<double>::infinity();
          } else if (proto.default_value() == "-inf") {
            result->default_value_double_ =
                -std::numeric_limits<double>::infinity();
          } else if (proto.default_value() == "nan") {
            result->default_value_double_ =
                std::numeric_limits<double>::quiet_NaN();
          } else  {
            result->default_value_double_ =
                io::NoLocaleStrtod(proto.default_value().c_str(), &end_pos);
          }
          break;
        case FieldDescriptor::CPPTYPE_BOOL:
          if (proto.default_value() == "true") {
            result->default_value_bool_ = true;
          } else if (proto.default_value() == "false") {
            result->default_value_bool_ = false;
          } else {
            AddError(result->full_name(), proto,
                     DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                     "Boolean default must be true or false.");
          }
          break;
        case FieldDescriptor::CPPTYPE_ENUM:
          // This will be filled in when cross-linking.
          result->default_value_enum_ = NULL;
          break;
        case FieldDescriptor::CPPTYPE_STRING:
          if (result->type() == FieldDescriptor::TYPE_BYTES) {
            result->default_value_string_ = tables_->AllocateString(
              UnescapeCEscapeString(proto.default_value()));
          } else {
            result->default_value_string_ =
                tables_->AllocateString(proto.default_value());
          }
          break;
        case FieldDescriptor::CPPTYPE_MESSAGE:
          AddError(result->full_name(), proto,
                   DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                   "Messages can't have default values.");
          result->has_default_value_ = false;
          break;
      }

      if (end_pos != NULL) {
        // end_pos is only set non-NULL by the parsers for numeric types, above.
        // This checks that the default was non-empty and had no extra junk
        // after the end of the number.
        if (proto.default_value().empty() || *end_pos != '\0') {
          AddError(result->full_name(), proto,
                   DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                   "Couldn't parse default value \"" + proto.default_value() +
                   "\".");
        }
      }
    } else {
      // No explicit default value
      switch (result->cpp_type()) {
        case FieldDescriptor::CPPTYPE_INT32:
          result->default_value_int32_ = 0;
          break;
        case FieldDescriptor::CPPTYPE_INT64:
          result->default_value_int64_ = 0;
          break;
        case FieldDescriptor::CPPTYPE_UINT32:
          result->default_value_uint32_ = 0;
          break;
        case FieldDescriptor::CPPTYPE_UINT64:
          result->default_value_uint64_ = 0;
          break;
        case FieldDescriptor::CPPTYPE_FLOAT:
          result->default_value_float_ = 0.0f;
          break;
        case FieldDescriptor::CPPTYPE_DOUBLE:
          result->default_value_double_ = 0.0;
          break;
        case FieldDescriptor::CPPTYPE_BOOL:
          result->default_value_bool_ = false;
          break;
        case FieldDescriptor::CPPTYPE_ENUM:
          // This will be filled in when cross-linking.
          result->default_value_enum_ = NULL;
          break;
        case FieldDescriptor::CPPTYPE_STRING:
          result->default_value_string_ = &internal::GetEmptyString();
          break;
        case FieldDescriptor::CPPTYPE_MESSAGE:
          break;
      }
    }
  }

  if (result->number() <= 0) {
    AddError(result->full_name(), proto, DescriptorPool::ErrorCollector::NUMBER,
             "Field numbers must be positive integers.");
  } else if (!is_extension && result->number() > FieldDescriptor::kMaxNumber) {
    // Only validate that the number is within the valid field range if it is
    // not an extension. Since extension numbers are validated with the
    // extendee's valid set of extension numbers, and those are in turn
    // validated against the max allowed number, the check is unnecessary for
    // extension fields.
    // This avoids cross-linking issues that arise when attempting to check if
    // the extendee is a message_set_wire_format message, which has a higher max
    // on extension numbers.
    AddError(result->full_name(), proto, DescriptorPool::ErrorCollector::NUMBER,
             strings::Substitute("Field numbers cannot be greater than $0.",
                                 FieldDescriptor::kMaxNumber));
  } else if (result->number() >= FieldDescriptor::kFirstReservedNumber &&
             result->number() <= FieldDescriptor::kLastReservedNumber) {
    AddError(result->full_name(), proto, DescriptorPool::ErrorCollector::NUMBER,
             strings::Substitute(
               "Field numbers $0 through $1 are reserved for the protocol "
               "buffer library implementation.",
               FieldDescriptor::kFirstReservedNumber,
               FieldDescriptor::kLastReservedNumber));
  }

  if (is_extension) {
    if (!proto.has_extendee()) {
      AddError(result->full_name(), proto,
               DescriptorPool::ErrorCollector::EXTENDEE,
               "FieldDescriptorProto.extendee not set for extension field.");
    }

    result->extension_scope_ = parent;

    if (proto.has_oneof_index()) {
      AddError(result->full_name(), proto,
               DescriptorPool::ErrorCollector::OTHER,
               "FieldDescriptorProto.oneof_index should not be set for "
               "extensions.");
    }

    // Fill in later (maybe).
    result->containing_oneof_ = NULL;
  } else {
    if (proto.has_extendee()) {
      AddError(result->full_name(), proto,
               DescriptorPool::ErrorCollector::EXTENDEE,
               "FieldDescriptorProto.extendee set for non-extension field.");
    }

    result->containing_type_ = parent;

    if (proto.has_oneof_index()) {
      if (proto.oneof_index() < 0 ||
          proto.oneof_index() >= parent->oneof_decl_count()) {
        AddError(result->full_name(), proto,
                 DescriptorPool::ErrorCollector::OTHER,
                 strings::Substitute("FieldDescriptorProto.oneof_index $0 is "
                                     "out of range for type \"$1\".",
                                     proto.oneof_index(),
                                     parent->name()));
        result->containing_oneof_ = NULL;
      } else {
        result->containing_oneof_ = parent->oneof_decl(proto.oneof_index());
      }
    } else {
      result->containing_oneof_ = NULL;
    }
  }

  // Copy options.
  if (!proto.has_options()) {
    result->options_ = NULL;  // Will set to default_instance later.
  } else {
    AllocateOptions(proto.options(), result);
  }


  AddSymbol(result->full_name(), parent, result->name(),
            proto, Symbol(result));
}